

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateObjectTypedef
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *extraout_RDX_01;
  GeneratorOptions *extraout_RDX_02;
  GeneratorOptions *options_00;
  long lVar3;
  long lVar4;
  string type_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar1 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_70.field_2._M_allocated_capacity = *psVar2;
    local_70.field_2._8_8_ = plVar1[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar2;
    local_70._M_dataplus._M_p = (pointer)*plVar1;
  }
  local_70._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  args_1 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)desc;
  io::Printer::Print<char[12],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,
             "/**\n * The raw object form of $messageName$ as accepted by the `fromObject` method.\n * @record\n */\n$typeName$ = function() {\n"
             ,(char (*) [12])"messageName",args_1,(char (*) [9])"typeName",&local_70);
  if (0 < *(int *)(desc + 0x68)) {
    lVar4 = 0;
    lVar3 = 0;
    options_00 = extraout_RDX;
    do {
      if (lVar3 != 0) {
        io::Printer::Print<>(printer,"\n");
        options_00 = extraout_RDX_00;
      }
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)(*(long *)(desc + 0x28) + lVar4),options_00,
                 (FieldDescriptor *)args_1);
      args_1 = &local_50;
      io::Printer::Print<char[10],std::__cxx11::string,char[10],char[2]>
                (printer,"  /** @type {$fieldType$|undefined} */\n  this.$fieldName$;\n",
                 (char (*) [10])"fieldName",&local_50,(char (*) [10])"fieldType",
                 (char (*) [2])0x396083);
      options_00 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
        options_00 = extraout_RDX_02;
      }
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x98;
    } while (lVar3 < *(int *)(desc + 0x68));
  }
  io::Printer::Print<>(printer,"};\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::GenerateObjectTypedef(const GeneratorOptions& options,
                                      io::Printer* printer,
                                      const Descriptor* desc) const {
  // TODO(b/122687752): Consider renaming nested messages called ObjectFormat
  //     to prevent collisions.
  const std::string type_name = GetMessagePath(options, desc) + ".ObjectFormat";

  printer->Print(
      "/**\n"
      " * The raw object form of $messageName$ as accepted by the `fromObject` "
      "method.\n"
      " * @record\n"
      " */\n"
      "$typeName$ = function() {\n",
      "messageName", desc->name(), "typeName", type_name);

  for (int i = 0; i < desc->field_count(); i++) {
    if (i > 0) {
      printer->Print("\n");
    }
    printer->Print(
        "  /** @type {$fieldType$|undefined} */\n"
        "  this.$fieldName$;\n",
        "fieldName", JSObjectFieldName(options, desc->field(i)),
        // TODO(b/121097361): Add type checking for field values.
        "fieldType", "?");
  }

  printer->Print("};\n\n");
}